

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
base64_decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
             string *encoded_string)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  long lVar5;
  bool bVar6;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  byte local_49 [4];
  byte local_45 [4];
  byte local_41;
  string *local_40;
  long local_38;
  
  local_40 = encoded_string;
  sVar4 = encoded_string->_M_string_length;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = 0;
  lVar3 = 0;
  while (bVar6 = sVar4 != 0, sVar4 = sVar4 - 1, bVar6) {
    bVar1 = (local_40->_M_dataplus)._M_p[lVar3];
    if (bVar1 == 0x3d) break;
    local_38 = lVar5;
    iVar2 = isalnum((uint)bVar1);
    lVar5 = local_38;
    if (((bVar1 & 0xfb) != 0x2b) && (iVar2 == 0)) break;
    local_49[local_38] = bVar1;
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 1;
    if (lVar5 == 4) {
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        bVar1 = std::__cxx11::string::find('P',(ulong)(uint)(int)(char)local_49[lVar5]);
        local_49[lVar5] = bVar1;
      }
      local_45[0] = local_49[1] >> 4 & 3 | local_49[0] << 2;
      local_45[1] = local_49[2] >> 2 & 0xf | local_49[1] << 4;
      local_45[2] = local_49[2] * '@' + local_49[3];
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        local_41 = local_45[lVar5];
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (__return_storage_ptr__,&local_41);
      }
      lVar5 = 0;
    }
  }
  if (lVar5 != 0) {
    for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
      bVar1 = std::__cxx11::string::find('P',(ulong)(uint)(int)(char)local_49[lVar3]);
      local_49[lVar3] = bVar1;
    }
    local_45[0] = local_49[1] >> 4 & 3 | local_49[0] << 2;
    local_45[1] = local_49[2] >> 2 & 0xf | local_49[1] << 4;
    for (lVar3 = 0; lVar5 + -1 != lVar3; lVar3 = lVar3 + 1) {
      local_45[3] = local_45[lVar3];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,local_45 + 3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> base64_decode(const std::string& encoded_string)
	{
		std::size_t in_len = encoded_string.size();
		std::size_t i = 0;
		std::size_t j = 0;
		std::size_t in_ = 0;
		unsigned char char_array_4[4], char_array_3[3];
		std::vector<uint8_t> ret;

		while (in_len-- && (encoded_string[in_] != '=') && is_base64(encoded_string[in_])) {
			char_array_4[i++] = encoded_string[in_]; in_++;
			if (i == 4) {
				for (i = 0; i < 4; i++)
					char_array_4[i] = (unsigned char)base64_chars.find(char_array_4[i]);

				char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
				char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
				char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

				for (i = 0; (i < 3); i++)
					ret.push_back((uint8_t)char_array_3[i]);
				i = 0;
			}
		}
		if (i) {
			for (j = 0; j < i; j++)
				char_array_4[j] = (unsigned char)base64_chars.find(char_array_4[j]);

			char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
			char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);

			for (j = 0; (j < i - 1); j++) ret.push_back((uint8_t)char_array_3[j]);
		}
		return ret;
	}